

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

bool slang::ast::isValidForceLVal(Expression *expr,ASTContext *context,bool inSelect)

{
  uint uVar1;
  Type *pTVar2;
  bool bVar3;
  Symbol *pSVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  do {
    lVar5 = 0x30;
    switch(expr->kind) {
    case NamedValue:
    case HierarchicalValue:
      pSVar4 = Expression::getSymbolReference(expr,true);
      if (pSVar4 == (Symbol *)0x0) {
        return true;
      }
      if ((((inSelect & 1U) == 0) || (uVar1 = pSVar4->kind - Variable, 0x18 < uVar1)) ||
         ((0x1800c0fU >> (uVar1 & 0x1f) & 1) == 0)) {
        if (pSVar4->kind != Net) {
          return true;
        }
        if (*(int *)(pSVar4[5].name._M_str + 0x80) != 0xe) {
          return true;
        }
        ASTContext::addDiag(context,(DiagCode)0x30008,expr->sourceRange);
        return true;
      }
    default:
      return false;
    case Concatenation:
      lVar5 = *(long *)(expr + 1);
      pTVar2 = expr[1].type.ptr;
      lVar6 = 0;
      do {
        bVar7 = (long)pTVar2 << 3 == lVar6;
        if (bVar7) {
          return bVar7;
        }
        bVar3 = isValidForceLVal(*(Expression **)(lVar5 + lVar6),context,false);
        lVar6 = lVar6 + 8;
      } while (bVar3);
      return bVar7;
    case MemberAccess:
      lVar5 = 0x38;
    case ElementSelect:
    case RangeSelect:
      expr = *(Expression **)((long)&expr->kind + lVar5);
      inSelect = true;
    }
  } while( true );
}

Assistant:

static bool isValidForceLVal(const Expression& expr, const ASTContext& context, bool inSelect) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (inSelect && VariableSymbol::isKind(sym->kind))
                    return false;

                if (sym->kind == SymbolKind::Net && !sym->as<NetSymbol>().netType.isBuiltIn())
                    context.addDiag(diag::BadForceNetType, expr.sourceRange);
            }
            return true;
        case ExpressionKind::MemberAccess:
            return isValidForceLVal(expr.as<MemberAccessExpression>().value(), context, true);
        case ExpressionKind::ElementSelect:
            return isValidForceLVal(expr.as<ElementSelectExpression>().value(), context, true);
        case ExpressionKind::RangeSelect:
            return isValidForceLVal(expr.as<RangeSelectExpression>().value(), context, true);
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidForceLVal(*op, context, false))
                    return false;
            }
            return true;
        default:
            return false;
    }
}